

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void PrintHelp(char **argv)

{
  putchar(10);
  puts("Search-Based Planning Library");
  putchar(10);
  printf("    %s -h\n",*argv);
  printf("    %s [-s] [--env=<env_t>] [--planner=<planner_t>] [--search-dir=<search_t>] <env cfg> [mot prim]\n"
         ,*argv);
  putchar(10);
  puts("[-s]                      (optional) Find a solution for an example navigation");
  puts("                          scenario where the robot only identifies obstacles as");
  puts("                          it approaches them.");
  puts("[--env=<env_t>]           (optional) Select an environment type to choose what");
  puts("                          example to run. The default is \"xytheta\".");
  puts("<env_t>                   One of 2d, xytheta, xythetamlev, robarm.");
  puts("[--planner=<planner_t>]   (optional) Select a planner to use for the example.");
  puts("                          The default is \"arastar\".");
  puts("<planner_t>               One of arastar, adstar, rstar, anastar.");
  puts("[--search-dir=<search_t>] (optional) Select the type of search to run. The default");
  puts("                          is \"backwards\".");
  puts("<search_t>                One of backward, forward.");
  puts("<env cfg>                 Config file representing the environment configuration.");
  puts("                          See sbpl/env_examples/ for examples.");
  puts("[mot prim]                (optional) Motion primitives file for x,y,theta lattice");
  puts("                          planning. See sbpl/matlab/mprim/ for examples.");
  puts("                          NOTE: resolution of motion primtives should match that");
  puts("                              of the config file.");
  puts("                          NOTE: optional use of these for x,y,theta planning is");
  puts("                              deprecated.");
  putchar(10);
  return;
}

Assistant:

void PrintHelp(char** argv)
{
    printf("\n");
    printf("Search-Based Planning Library\n");
    printf("\n");
    printf("    %s -h\n", argv[0]);
    printf("    %s [-s] [--env=<env_t>] [--planner=<planner_t>] [--search-dir=<search_t>] <env cfg> [mot prim]\n",
           argv[0]);
    printf("\n");
    printf("[-s]                      (optional) Find a solution for an example navigation\n");
    printf("                          scenario where the robot only identifies obstacles as\n");
    printf("                          it approaches them.\n");
    printf("[--env=<env_t>]           (optional) Select an environment type to choose what\n");
    printf("                          example to run. The default is \"xytheta\".\n");
    printf("<env_t>                   One of 2d, xytheta, xythetamlev, robarm.\n");
    printf("[--planner=<planner_t>]   (optional) Select a planner to use for the example.\n");
    printf("                          The default is \"arastar\".\n");
    printf("<planner_t>               One of arastar, adstar, rstar, anastar.\n");
    printf("[--search-dir=<search_t>] (optional) Select the type of search to run. The default\n");
    printf("                          is \"backwards\".\n");
    printf("<search_t>                One of backward, forward.\n");
    printf("<env cfg>                 Config file representing the environment configuration.\n");
    printf("                          See sbpl/env_examples/ for examples.\n");
    printf("[mot prim]                (optional) Motion primitives file for x,y,theta lattice\n");
    printf("                          planning. See sbpl/matlab/mprim/ for examples.\n");
    printf("                          NOTE: resolution of motion primtives should match that\n");
    printf("                              of the config file.\n");
    printf("                          NOTE: optional use of these for x,y,theta planning is\n");
    printf("                              deprecated.\n");
    printf("\n");
}